

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_lib.cc
# Opt level: O0

uint64_t SSL_get_read_sequence(SSL *ssl)

{
  uint16_t epoch;
  int iVar1;
  uint64_t uVar2;
  DTLSRecordNumber local_28;
  uint16_t *local_20;
  DTLSReadEpoch *read_epoch;
  SSL *ssl_local;
  
  read_epoch = (DTLSReadEpoch *)ssl;
  iVar1 = SSL_is_dtls(ssl);
  if (iVar1 == 0) {
    ssl_local = *(SSL **)(read_epoch->bitmap).map_.super__Base_bitset<4UL>._M_w[3];
  }
  else {
    uVar2 = (read_epoch->bitmap).max_seq_num_;
    local_20 = (uint16_t *)(uVar2 + 8);
    epoch = *local_20;
    uVar2 = bssl::DTLSReplayBitmap::max_seq_num((DTLSReplayBitmap *)(uVar2 + 0x20));
    bssl::DTLSRecordNumber::DTLSRecordNumber(&local_28,epoch,uVar2);
    ssl_local = (SSL *)bssl::DTLSRecordNumber::combined(&local_28);
  }
  return (uint64_t)ssl_local;
}

Assistant:

uint64_t SSL_get_read_sequence(const SSL *ssl) {
  if (SSL_is_dtls(ssl)) {
    // TODO(crbug.com/42290608): This API should not be implemented for DTLS or
    // QUIC. In QUIC we do not maintain a sequence number.
    const DTLSReadEpoch *read_epoch = &ssl->d1->read_epoch;
    return DTLSRecordNumber(read_epoch->epoch, read_epoch->bitmap.max_seq_num())
        .combined();
  }
  return ssl->s3->read_sequence;
}